

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::TreeEnsembleParameters::TreeEnsembleParameters
          (TreeEnsembleParameters *this,Arena *arena,bool is_message_owned)

{
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__MessageLite_004be5f0;
  google::protobuf::internal::InternalMetadata::InternalMetadata
            (&(this->super_MessageLite)._internal_metadata_,arena,is_message_owned);
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__TreeEnsembleParameters_004bc320;
  (this->nodes_).super_RepeatedPtrFieldBase.arena_ = arena;
  (this->nodes_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->nodes_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->nodes_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  (this->basepredictionvalue_).current_size_ = 0;
  (this->basepredictionvalue_).total_size_ = 0;
  (this->basepredictionvalue_).arena_or_elements_ = arena;
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = 0;
  this->numpredictiondimensions_ = 0;
  return;
}

Assistant:

TreeEnsembleParameters::TreeEnsembleParameters(::PROTOBUF_NAMESPACE_ID::Arena* arena,
                         bool is_message_owned)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite(arena, is_message_owned),
  nodes_(arena),
  basepredictionvalue_(arena) {
  SharedCtor();
  if (!is_message_owned) {
    RegisterArenaDtor(arena);
  }
  // @@protoc_insertion_point(arena_constructor:CoreML.Specification.TreeEnsembleParameters)
}